

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::SelfSelectClient::send(SelfSelectClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Ch *__n_00;
  size_t sVar1;
  ssize_t extraout_RAX;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  StringBuffer buffer;
  CrtAllocator *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_stack_ffffffffffffff38;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_ffffffffffffff40;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_ffffffffffffff80;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff88;
  
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28,0x1f0cf3);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Writer(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
           (CrtAllocator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
           (size_t)in_stack_ffffffffffffff28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  __n_00 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)__buf);
  sVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x1f0d5b
                    );
  send(this,__fd,__buf,(size_t)__n_00,(int)sVar1);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)0x1f0d89);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x1f0d96);
  return extraout_RAX;
}

Assistant:

void xmrig::SelfSelectClient::send(int method, const char *url, const rapidjson::Document &doc)
{
    using namespace rapidjson;

    StringBuffer buffer(nullptr, 512);
    Writer<StringBuffer> writer(buffer);
    doc.Accept(writer);

    send(method, url, buffer.GetString(), buffer.GetSize());
}